

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O0

void __thiscall juzzlin::SimpleLogger::Impl::flushFileIfOpen(Impl *this)

{
  ulong uVar1;
  ostream *this_00;
  string local_28 [40];
  
  uVar1 = std::ofstream::is_open();
  if ((uVar1 & 1) != 0) {
    std::__cxx11::ostringstream::str();
    this_00 = std::operator<<((ostream *)m_fileStream,local_28);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_28);
    std::ostream::flush();
  }
  return;
}

Assistant:

void SimpleLogger::Impl::flushFileIfOpen()
{
    if (m_fileStream.is_open()) {
        m_fileStream << m_message.str() << std::endl;
        m_fileStream.flush();
    }
}